

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sec.c
# Opt level: O2

edata_t * sec_alloc(tsdn_t *tsdn,pai_t *self,size_t size,size_t alignment,_Bool zero,_Bool guarded,
                   _Bool frequent_reuse,_Bool *deferred_work_generated)

{
  bool bVar1;
  bool bVar2;
  tsdn_t *tsdn_00;
  edata_list_active_t eVar3;
  ulong uVar4;
  sec_shard_t *psVar5;
  edata_t *peVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  _func__Bool_tsdn_t_ptr_pai_t_ptr_edata_t_ptr_size_t_size_t__Bool_ptr *p_Var11;
  sec_bin_t *psVar12;
  undefined1 local_61;
  anon_struct_8_1_803fbc3e_for_head local_60;
  tsdn_t *local_58;
  sec_shard_t *local_50;
  pthread_mutex_t *local_48;
  edata_list_active_t result;
  
  if (((0x1000 < alignment || zero) ||
      (self[1].alloc_batch ==
       (_func_size_t_tsdn_t_ptr_pai_t_ptr_size_t_size_t_edata_list_active_t_ptr__Bool__Bool_ptr *)
       0x0)) || (self[1].expand < size)) {
    local_60.qlh_first =
         (edata_t *)
         (**(code **)self[1].alloc)
                   (tsdn,self[1].alloc,size,alignment,zero,0,frequent_reuse,deferred_work_generated)
    ;
  }
  else {
    if (size < 0x7000000000000001) {
      uVar4 = size - 1;
      if (uVar4 == 0) {
        uVar8 = 0x40;
      }
      else {
        lVar10 = 0x3f;
        if (uVar4 != 0) {
          for (; uVar4 >> lVar10 == 0; lVar10 = lVar10 + -1) {
          }
        }
        uVar8 = (uint)lVar10 ^ 0x3f;
      }
      iVar9 = 0x32 - uVar8;
      if (0x32 < uVar8) {
        iVar9 = 0;
      }
      bVar7 = 0xc;
      if (0x4000 < size) {
        bVar7 = (char)iVar9 + 0xb;
      }
      uVar4 = (ulong)(((uint)(uVar4 >> (bVar7 & 0x3f)) & 3) + iVar9 * 4);
    }
    else {
      uVar4 = 199;
    }
    psVar5 = sec_shard_pick(tsdn,(sec_t *)self);
    psVar12 = psVar5->bins + uVar4;
    local_58 = tsdn;
    local_50 = psVar5;
    malloc_mutex_lock(tsdn,&psVar5->mtx);
    local_48 = (pthread_mutex_t *)psVar5;
    if ((psVar5->enabled == true) &&
       (peVar6 = (psVar12->freelist).head.qlh_first, peVar6 != (edata_t *)0x0)) {
      edata_list_active_remove(&psVar12->freelist,peVar6);
      psVar12->bytes_cur = psVar12->bytes_cur - ((peVar6->field_2).e_size_esn & 0xfffffffffffff000);
      local_50->bytes_cur =
           local_50->bytes_cur - ((peVar6->field_2).e_size_esn & 0xfffffffffffff000);
      bVar1 = false;
      bVar2 = false;
      local_60.qlh_first = peVar6;
    }
    else if ((psVar12->being_batch_filled == false) &&
            (self[1].dalloc_batch !=
             (_func_void_tsdn_t_ptr_pai_t_ptr_edata_list_active_t_ptr__Bool_ptr *)0x0)) {
      psVar12->being_batch_filled = true;
      bVar1 = true;
      local_60.qlh_first = (edata_t *)0x0;
      bVar2 = true;
    }
    else {
      local_60.qlh_first = (edata_t *)0x0;
      bVar2 = false;
      bVar1 = true;
    }
    tsdn_00 = local_58;
    (local_50->mtx).field_0.field_0.locked.repr = false;
    local_48 = (pthread_mutex_t *)((long)&((malloc_mutex_t *)local_48)->field_0 + 0x48);
    pthread_mutex_unlock(local_48);
    if (bVar1) {
      if (!bVar2) {
        peVar6 = (edata_t *)(**(code **)self[1].alloc)(tsdn_00,self[1].alloc,size,alignment,0,0);
        return peVar6;
      }
      result.head.qlh_first = (anon_struct_8_1_803fbc3e_for_head)(edata_t *)0x0;
      local_61 = 0;
      uVar4 = (**(code **)(self[1].alloc + 8))
                        (tsdn_00,self[1].alloc,size,self[1].dalloc_batch + 1,&result,frequent_reuse,
                         &local_61);
      eVar3 = result;
      if (result.head.qlh_first != (edata_t *)0x0) {
        edata_list_active_remove(&result,(edata_t *)result.head.qlh_first);
      }
      psVar5 = local_50;
      local_60 = eVar3.head.qlh_first;
      malloc_mutex_lock(tsdn_00,&local_50->mtx);
      psVar12->being_batch_filled = false;
      if (1 < uVar4) {
        lVar10 = (uVar4 - 1) * size;
        edata_list_active_concat(&psVar12->freelist,&result);
        psVar12->bytes_cur = psVar12->bytes_cur + lVar10;
        p_Var11 = (_func__Bool_tsdn_t_ptr_pai_t_ptr_edata_t_ptr_size_t_size_t__Bool_ptr *)
                  (lVar10 + psVar5->bytes_cur);
        psVar5->bytes_cur = (size_t)p_Var11;
        if (self[1].shrink < p_Var11) {
          sec_flush_some_and_unlock(local_58,(sec_t *)self,psVar5);
          return local_60.qlh_first;
        }
      }
      (psVar5->mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock(local_48);
    }
  }
  return local_60.qlh_first;
}

Assistant:

static edata_t *
sec_alloc(tsdn_t *tsdn, pai_t *self, size_t size, size_t alignment, bool zero,
    bool guarded, bool frequent_reuse, bool *deferred_work_generated) {
	assert((size & PAGE_MASK) == 0);
	assert(!guarded);

	sec_t *sec = (sec_t *)self;

	if (zero || alignment > PAGE || sec->opts.nshards == 0
	    || size > sec->opts.max_alloc) {
		return pai_alloc(tsdn, sec->fallback, size, alignment, zero,
		    /* guarded */ false, frequent_reuse,
		    deferred_work_generated);
	}
	pszind_t pszind = sz_psz2ind(size);
	assert(pszind < sec->npsizes);

	sec_shard_t *shard = sec_shard_pick(tsdn, sec);
	sec_bin_t *bin = &shard->bins[pszind];
	bool do_batch_fill = false;

	malloc_mutex_lock(tsdn, &shard->mtx);
	edata_t *edata = sec_shard_alloc_locked(tsdn, sec, shard, bin);
	if (edata == NULL) {
		if (!bin->being_batch_filled
		    && sec->opts.batch_fill_extra > 0) {
			bin->being_batch_filled = true;
			do_batch_fill = true;
		}
	}
	malloc_mutex_unlock(tsdn, &shard->mtx);
	if (edata == NULL) {
		if (do_batch_fill) {
			edata = sec_batch_fill_and_alloc(tsdn, sec, shard, bin,
			    size, frequent_reuse);
		} else {
			edata = pai_alloc(tsdn, sec->fallback, size, alignment,
			    zero, /* guarded */ false, frequent_reuse,
			    deferred_work_generated);
		}
	}
	return edata;
}